

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void luaE_shrinkCI(lua_State *L)

{
  CallInfo *block;
  CallInfo *pCVar1;
  CallInfo *pCVar2;
  
  pCVar2 = L->ci;
  while ((block = pCVar2->next, block != (CallInfo *)0x0 &&
         (pCVar1 = block->next, pCVar1 != (CallInfo *)0x0))) {
    luaM_realloc_(L,block,0x48,0);
    L->nci = L->nci - 1;
    pCVar2->next = pCVar1;
    pCVar1->previous = pCVar2;
    pCVar2 = pCVar1;
  }
  return;
}

Assistant:

void luaE_shrinkCI(lua_State *L) {
    CallInfo *ci = L->ci;
    CallInfo *next2;  /* next's next */
    /* while there are two nexts */
    while (ci->next != NULL && (next2 = ci->next->next) != NULL) {
        luaM_free(L, ci->next);  /* free next */
        L->nci--;
        ci->next = next2;  /* remove 'next' from the list */
        next2->previous = ci;
        ci = next2;  /* keep next's next */
    }
}